

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::Printf<float&>(char *fmt,float *args)

{
  float *in_RCX;
  string s;
  string local_28;
  
  StringPrintf<float&>(&local_28,(pbrt *)fmt,(char *)args,in_RCX);
  fputs(local_28._M_dataplus._M_p,_stdout);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}